

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eternal.hpp
# Opt level: O0

const_iterator __thiscall
mapbox::eternal::impl::
map<mapbox::eternal::impl::element<unsigned_int,_mapbox::eternal::string>,_22UL>::find
          (map<mapbox::eternal::impl::element<unsigned_int,_mapbox::eternal::string>,_22UL> *this,
          key_type *key)

{
  bool local_32;
  greater_equal local_31;
  map<mapbox::eternal::impl::element<unsigned_int,_mapbox::eternal::string>,_22UL> *local_30;
  element<unsigned_int,_mapbox::eternal::string> *it;
  key_type *pkStack_20;
  compare_key_type compare_key;
  key_type *key_local;
  map<mapbox::eternal::impl::element<unsigned_int,_mapbox::eternal::string>,_22UL> *this_local;
  
  pkStack_20 = key;
  compare_key<unsigned_int>::compare_key((compare_key<unsigned_int> *)((long)&it + 4),key);
  local_30 = (map<mapbox::eternal::impl::element<unsigned_int,_mapbox::eternal::string>,_22UL> *)
             bound<mapbox::eternal::impl::less,mapbox::eternal::impl::element<unsigned_int,mapbox::eternal::string>const*,mapbox::eternal::impl::compare_key<unsigned_int>>
                       (this->data_,this[1].data_,(compare_key<unsigned_int> *)((long)&it + 4));
  local_32 = false;
  if (local_30 != this + 1) {
    local_32 = greater_equal::operator()
                         (&local_31,(element<unsigned_int,_mapbox::eternal::string> *)local_30,
                          (compare_key<unsigned_int> *)((long)&it + 4));
  }
  if (local_32 == false) {
    this_local = (map<mapbox::eternal::impl::element<unsigned_int,_mapbox::eternal::string>,_22UL> *
                 )end(this);
  }
  else {
    iterator<mapbox::eternal::impl::element<unsigned_int,_mapbox::eternal::string>_>::iterator
              ((iterator<mapbox::eternal::impl::element<unsigned_int,_mapbox::eternal::string>_> *)
               &this_local,local_30->data_);
  }
  return (const_iterator)this_local->data_;
}

Assistant:

find(const key_type& key) const noexcept {
        const compare_key_type compare_key{ key };
        auto it = bound<less>(data_, data_ + N, compare_key);
        if (it != data_ + N && greater_equal()(*it, compare_key)) {
            return it;
        } else {
            return end();
        }
    }